

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

void __thiscall
MemoryLeakOutputStringBuffer::stopMemoryLeakReporting(MemoryLeakOutputStringBuffer *this)

{
  byte bVar1;
  long *in_RDI;
  bool buffer_reached_its_capacity;
  undefined7 in_stack_fffffffffffffff0;
  
  if (*in_RDI == 0) {
    addNoMemoryLeaksMessage((MemoryLeakOutputStringBuffer *)0x11b341);
  }
  else {
    bVar1 = SimpleStringBuffer::reachedItsCapacity((SimpleStringBuffer *)(in_RDI + 2));
    SimpleStringBuffer::resetWriteLimit((SimpleStringBuffer *)(in_RDI + 2));
    if ((bVar1 & 1) != 0) {
      addErrorMessageForTooMuchLeaks((MemoryLeakOutputStringBuffer *)0x11b373);
    }
    addMemoryLeakFooter((MemoryLeakOutputStringBuffer *)CONCAT17(bVar1,in_stack_fffffffffffffff0),
                        (size_t)in_RDI);
    if ((*(byte *)(in_RDI + 1) & 1) != 0) {
      addWarningForUsingMalloc((MemoryLeakOutputStringBuffer *)0x11b392);
    }
  }
  return;
}

Assistant:

void MemoryLeakOutputStringBuffer::stopMemoryLeakReporting()
{
    if (total_leaks_ == 0) {
        addNoMemoryLeaksMessage();
        return;
    }

    bool buffer_reached_its_capacity = outputBuffer_.reachedItsCapacity();
    outputBuffer_.resetWriteLimit();

    if (buffer_reached_its_capacity)
        addErrorMessageForTooMuchLeaks();

    addMemoryLeakFooter(total_leaks_);

    if (giveWarningOnUsingMalloc_)
        addWarningForUsingMalloc();

}